

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.h
# Opt level: O0

char * __thiscall wabt::Type::GetRefKindName(Type *this)

{
  Type *this_local;
  
  switch(this->enum_) {
  case Array:
    this_local = (Type *)anon_var_dwarf_921ce;
    break;
  case Struct:
    this_local = (Type *)anon_var_dwarf_90b80;
    break;
  default:
    this_local = (Type *)anon_var_dwarf_12c0e6;
    break;
  case ExternRef:
    this_local = (Type *)0x21edfc;
    break;
  case FuncRef:
    this_local = (Type *)0x21f7d1;
  }
  return (char *)this_local;
}

Assistant:

const char* GetRefKindName() const {
    switch (enum_) {
      case Type::FuncRef:   return "func";
      case Type::ExternRef: return "extern";
      case Type::Struct:    return "struct";
      case Type::Array:     return "array";
      default:              return "<invalid>";
    }
  }